

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_session.cpp
# Opt level: O2

void __thiscall cab_session::handle_update(cab_session *this)

{
  buffer *buffer;
  cab *this_00;
  pointer puVar1;
  bool bVar2;
  ostream *poVar3;
  node_type *pnVar4;
  backend_position_update_message position_message;
  node_type local_89;
  backend_route_update_message route_message;
  vector<node_type,_std::allocator<node_type>_> converted;
  _Vector_base<node_type,_std::allocator<node_type>_> local_48;
  
  route_message.route.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  route_message.route.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  route_message.route.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer = &this->_buffer;
  bVar2 = basic_message<backend_position_update_message,_(message_id)194>::readable
                    ((basic_message<backend_position_update_message,_(message_id)194> *)
                     &position_message,buffer);
  if (bVar2) {
    basic_message<backend_position_update_message,_(message_id)194>::from_buffer
              ((basic_message<backend_position_update_message,_(message_id)194> *)&position_message,
               buffer);
    poVar3 = std::operator<<((ostream *)&std::cout,"Cab with id ");
    cab::id(this->_cab);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," moved to ");
    poVar3 = ::operator<<(poVar3,position_message.position);
    std::operator<<(poVar3,'\n');
    cab::update_position(this->_cab,position_message.position);
  }
  else {
    bVar2 = basic_message<backend_route_update_message,_(message_id)195>::readable
                      ((basic_message<backend_route_update_message,_(message_id)195> *)
                       &route_message,buffer);
    if (bVar2) {
      basic_message<backend_route_update_message,_(message_id)195>::from_buffer
                ((basic_message<backend_route_update_message,_(message_id)195> *)&route_message,
                 buffer);
      poVar3 = std::operator<<((ostream *)&std::cout,"Cab with id ");
      cab::id(this->_cab);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," updated its route\n");
      converted.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      converted.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      converted.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<node_type,_std::allocator<node_type>_>::reserve
                (&converted,
                 (ulong)(((int)route_message.route.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (int)route_message.route.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start) + 9));
      std::operator<<((ostream *)&std::cout,"received route: ");
      puVar1 = route_message.route.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar4 = route_message.route.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start; pnVar4 != puVar1; pnVar4 = pnVar4 + 1) {
        local_89 = *pnVar4;
        std::vector<node_type,_std::allocator<node_type>_>::emplace_back<node_type>
                  (&converted,&local_89);
        poVar3 = ::operator<<((ostream *)&std::cout,
                              converted.super__Vector_base<node_type,_std::allocator<node_type>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1]);
        std::operator<<(poVar3,", ");
      }
      std::operator<<((ostream *)&std::cout,'\n');
      this_00 = this->_cab;
      std::vector<node_type,_std::allocator<node_type>_>::vector
                ((vector<node_type,_std::allocator<node_type>_> *)&local_48,&converted);
      cab::update_route(this_00,(vector<node_type,_std::allocator<node_type>_> *)&local_48);
      std::_Vector_base<node_type,_std::allocator<node_type>_>::~_Vector_base(&local_48);
      std::_Vector_base<node_type,_std::allocator<node_type>_>::~_Vector_base
                (&converted.super__Vector_base<node_type,_std::allocator<node_type>_>);
    }
  }
  handle_receive(this);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&route_message);
  return;
}

Assistant:

void cab_session::handle_update()
{
    backend_position_update_message position_message;
    backend_route_update_message route_message;
    if(position_message.readable(_buffer))
    {
        position_message.from_buffer(_buffer);

        std::cout << "Cab with id " << _cab->id() << " moved to " << static_cast<node_type>(position_message.position) << '\n';

        _cab->update_position(static_cast<node_type>(position_message.position));
    }
    else if(route_message.readable(_buffer))
    {
        route_message.from_buffer(_buffer);

        std::cout << "Cab with id " << _cab->id() << " updated its route\n";

        std::vector<node_type> converted;
        converted.reserve(route_message.size());
        std::cout << "received route: ";
        for(auto e : route_message.route)
        {
            converted.push_back(static_cast<node_type>(e));
            std::cout << converted.back() << ", ";
        }
        std::cout << '\n';
        _cab->update_route(converted);
    }

    handle_receive();
}